

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

wchar_t parse_type(char *s)

{
  int iVar1;
  uint local_1c;
  char *pcStack_18;
  wchar_t rv;
  char *s_local;
  
  pcStack_18 = s;
  if (*s == '?') {
    pcStack_18 = s + 1;
  }
  local_1c = (uint)(*s == '?');
  iVar1 = strcmp(pcStack_18,"int");
  if (iVar1 == 0) {
    s_local._4_4_ = local_1c | 2;
  }
  else {
    iVar1 = strcmp(pcStack_18,"sym");
    if (iVar1 == 0) {
      s_local._4_4_ = local_1c | 4;
    }
    else {
      iVar1 = strcmp(pcStack_18,"str");
      if (iVar1 == 0) {
        s_local._4_4_ = local_1c | 6;
      }
      else {
        iVar1 = strcmp(pcStack_18,"rand");
        if (iVar1 == 0) {
          s_local._4_4_ = local_1c | 8;
        }
        else {
          iVar1 = strcmp(pcStack_18,"uint");
          if (iVar1 == 0) {
            s_local._4_4_ = local_1c | 10;
          }
          else {
            iVar1 = strcmp(pcStack_18,"char");
            if (iVar1 == 0) {
              s_local._4_4_ = local_1c | 0xc;
            }
            else {
              s_local._4_4_ = L'\0';
            }
          }
        }
      }
    }
  }
  return s_local._4_4_;
}

Assistant:

static int parse_type(const char *s) {
	int rv = 0;
	if (s[0] == '?') {
		rv |= PARSE_T_OPT;
		s++;
	}
	if (streq(s, "int"))
		return PARSE_T_INT | rv;
	if (streq(s, "sym"))
		return PARSE_T_SYM | rv;
	if (streq(s, "str"))
		return PARSE_T_STR | rv;
	if (streq(s, "rand"))
		return PARSE_T_RAND | rv;
	if (streq(s, "uint"))
		return PARSE_T_UINT | rv;
	if (streq(s, "char"))
		return PARSE_T_CHAR | rv;
	return PARSE_T_NONE;
}